

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfcc.hpp
# Opt level: O0

Mat_<double> *
mel_spectrogram_create(Mat_<double> *__return_storage_ptr__,int nps,int n_fft,int n_mels)

{
  int _cols;
  double *pdVar1;
  double dVar2;
  double dVar3;
  int local_cc4;
  int local_cc0;
  int k;
  int j_5;
  int j_4;
  Mat_<double> enorm;
  undefined1 local_c50 [4];
  int j_3;
  double local_c38;
  _InputArray local_c30;
  _InputArray local_c18;
  Mat_<double> local_c00;
  Mat local_ba0 [8];
  Mat weights_1;
  Mat local_b40 [8];
  Mat c2;
  Mat local_ae0 [8];
  Mat c1;
  Mat local_a80 [352];
  undefined1 local_920 [8];
  Mat_<double> upper;
  MatExpr local_760 [352];
  undefined1 local_600 [8];
  Mat_<double> lower;
  undefined1 local_598 [4];
  int j_2;
  Mat_<double> ramps_2;
  undefined1 local_530 [4];
  int j_1;
  Mat_<double> ramps_1;
  int local_4c8;
  int i_1;
  int j;
  int i;
  Mat_<double> ramps;
  undefined1 local_300 [8];
  Mat_<double> fdiff;
  Mat_<double> d2;
  Mat_<double> d1;
  undefined1 local_180 [8];
  Mat_<double> mel_f;
  Mat_<double> mels;
  double max_mel;
  double min_mel;
  undefined1 local_a0 [8];
  Mat_<double> fftfreqs;
  int n_fft_2;
  double f_min;
  double f_max;
  int n_mels_local;
  int n_fft_local;
  int nps_local;
  Mat_<double> *weights;
  
  _cols = n_fft / 2 + 1;
  fftfreqs._88_8_ = 0;
  cv::Mat_<double>::Mat_(__return_storage_ptr__,n_mels,_cols,(double *)&fftfreqs.field_0x58);
  cvlinspace((Mat_<double> *)local_a0,0.0,(double)nps * 0.5,_cols);
  dVar2 = hz_to_mel(0.0,false);
  dVar3 = hz_to_mel((double)nps * 0.5,false);
  cvlinspace((Mat_<double> *)&mel_f.field_0x58,dVar2,dVar3,n_mels + 2);
  cv::Mat_<double>::Mat_((Mat_<double> *)&d1.field_0x58,(Mat_<double> *)&mel_f.field_0x58);
  mel_to_hz((Mat_<double> *)local_180,(Mat_<double> *)&d1.field_0x58,false);
  cv::Mat_<double>::~Mat_((Mat_<double> *)&d1.field_0x58);
  cv::Mat_<double>::Mat_
            ((Mat_<double> *)&d2.field_0x58,1,mel_f._4_4_ * mel_f._0_4_ + -1,
             (double *)(mel_f._8_8_ + 8),0);
  cv::Mat_<double>::Mat_
            ((Mat_<double> *)&fdiff.field_0x58,1,mel_f._4_4_ * mel_f._0_4_ + -1,
             (double *)mel_f._8_8_,0);
  cv::operator-((Mat *)&ramps.field_0x58,(Mat *)&d2.field_0x58);
  cv::Mat_<double>::Mat_((Mat_<double> *)local_300,(MatExpr *)&ramps.field_0x58);
  cv::MatExpr::~MatExpr((MatExpr *)&ramps.field_0x58);
  cv::Mat_<double>::Mat_((Mat_<double> *)&j,mel_f._4_4_,fftfreqs._4_4_);
  for (i_1 = 0; i_1 < (int)mel_f._4_4_; i_1 = i_1 + 1) {
    for (local_4c8 = 0; local_4c8 < (int)fftfreqs._4_4_; local_4c8 = local_4c8 + 1) {
      pdVar1 = cv::Mat_<double>::operator()((Mat_<double> *)local_180,0,i_1);
      dVar2 = *pdVar1;
      pdVar1 = cv::Mat_<double>::operator()((Mat_<double> *)local_a0,0,local_4c8);
      dVar3 = *pdVar1;
      pdVar1 = cv::Mat_<double>::operator()((Mat_<double> *)&j,i_1,local_4c8);
      *pdVar1 = dVar2 - dVar3;
    }
  }
  for (ramps_1._92_4_ = 0; (int)ramps_1._92_4_ < n_mels; ramps_1._92_4_ = ramps_1._92_4_ + 1) {
    cv::Mat_<double>::Mat_((Mat_<double> *)local_530,1,ramps._4_4_);
    for (ramps_2._92_4_ = 0; (int)ramps_2._92_4_ < (int)ramps._4_4_;
        ramps_2._92_4_ = ramps_2._92_4_ + 1) {
      pdVar1 = cv::Mat_<double>::operator()((Mat_<double> *)&j,ramps_1._92_4_,ramps_2._92_4_);
      dVar2 = *pdVar1;
      pdVar1 = cv::Mat_<double>::operator()((Mat_<double> *)local_530,0,ramps_2._92_4_);
      *pdVar1 = dVar2;
    }
    cv::Mat_<double>::Mat_((Mat_<double> *)local_598,1,ramps._4_4_);
    for (lower._92_4_ = 0; (int)lower._92_4_ < (int)ramps._4_4_; lower._92_4_ = lower._92_4_ + 1) {
      pdVar1 = cv::Mat_<double>::operator()((Mat_<double> *)&j,ramps_1._92_4_ + 2,lower._92_4_);
      dVar2 = *pdVar1;
      pdVar1 = cv::Mat_<double>::operator()((Mat_<double> *)local_598,0,lower._92_4_);
      *pdVar1 = dVar2;
    }
    cv::operator*((Mat *)&upper.field_0x58,-1.0);
    pdVar1 = cv::Mat_<double>::operator()((Mat_<double> *)local_300,0,ramps_1._92_4_);
    cv::operator/(local_760,*pdVar1);
    cv::Mat_<double>::Mat_((Mat_<double> *)local_600,local_760);
    cv::MatExpr::~MatExpr(local_760);
    cv::MatExpr::~MatExpr((MatExpr *)&upper.field_0x58);
    pdVar1 = cv::Mat_<double>::operator()((Mat_<double> *)local_300,0,ramps_1._92_4_ + 1);
    cv::operator/(local_a80,*pdVar1);
    cv::Mat_<double>::Mat_((Mat_<double> *)local_920,(MatExpr *)local_a80);
    cv::MatExpr::~MatExpr((MatExpr *)local_a80);
    cv::Mat::Mat(local_ae0,(Mat *)local_600);
    cv::Mat::Mat(local_b40,(Mat *)local_920);
    cv::Mat_<double>::Mat_(&local_c00,1,lower._4_4_);
    cv::Mat::Mat(local_ba0,&local_c00.super_Mat);
    cv::Mat_<double>::~Mat_(&local_c00);
    cv::min(local_ae0,local_b40,local_ba0);
    cv::_InputArray::_InputArray(&local_c18,local_ba0);
    local_c38 = 0.0;
    cv::_InputArray::_InputArray(&local_c30,&local_c38);
    cv::_OutputArray::_OutputArray((_OutputArray *)local_c50,local_ba0);
    cv::max(&local_c18,&local_c30,(_OutputArray *)local_c50);
    cv::_OutputArray::~_OutputArray((_OutputArray *)local_c50);
    cv::_InputArray::~_InputArray(&local_c30);
    cv::_InputArray::~_InputArray(&local_c18);
    for (enorm._92_4_ = 0; (int)enorm._92_4_ < _cols; enorm._92_4_ = enorm._92_4_ + 1) {
      pdVar1 = cv::Mat::at<double>(local_ba0,0,enorm._92_4_);
      dVar2 = *pdVar1;
      pdVar1 = cv::Mat_<double>::operator()(__return_storage_ptr__,ramps_1._92_4_,enorm._92_4_);
      *pdVar1 = dVar2;
    }
    cv::Mat::~Mat(local_ba0);
    cv::Mat::~Mat(local_b40);
    cv::Mat::~Mat(local_ae0);
    cv::Mat_<double>::~Mat_((Mat_<double> *)local_920);
    cv::Mat_<double>::~Mat_((Mat_<double> *)local_600);
    cv::Mat_<double>::~Mat_((Mat_<double> *)local_598);
    cv::Mat_<double>::~Mat_((Mat_<double> *)local_530);
  }
  cv::Mat_<double>::Mat_((Mat_<double> *)&j_5,1,n_mels);
  for (k = 0; k < n_mels; k = k + 1) {
    pdVar1 = cv::Mat_<double>::operator()((Mat_<double> *)local_180,0,k + 2);
    dVar2 = *pdVar1;
    pdVar1 = cv::Mat_<double>::operator()((Mat_<double> *)local_180,0,k);
    dVar3 = *pdVar1;
    pdVar1 = cv::Mat_<double>::operator()((Mat_<double> *)&j_5,0,k);
    *pdVar1 = 2.0 / (dVar2 - dVar3);
  }
  for (local_cc0 = 0; local_cc0 < n_mels; local_cc0 = local_cc0 + 1) {
    for (local_cc4 = 0; local_cc4 < _cols; local_cc4 = local_cc4 + 1) {
      pdVar1 = cv::Mat_<double>::operator()((Mat_<double> *)&j_5,0,local_cc0);
      dVar2 = *pdVar1;
      pdVar1 = cv::Mat_<double>::operator()(__return_storage_ptr__,local_cc0,local_cc4);
      *pdVar1 = dVar2 * *pdVar1;
    }
  }
  cv::Mat_<double>::~Mat_((Mat_<double> *)&j_5);
  cv::Mat_<double>::~Mat_((Mat_<double> *)&j);
  cv::Mat_<double>::~Mat_((Mat_<double> *)local_300);
  cv::Mat_<double>::~Mat_((Mat_<double> *)&fdiff.field_0x58);
  cv::Mat_<double>::~Mat_((Mat_<double> *)&d2.field_0x58);
  cv::Mat_<double>::~Mat_((Mat_<double> *)local_180);
  cv::Mat_<double>::~Mat_((Mat_<double> *)&mel_f.field_0x58);
  cv::Mat_<double>::~Mat_((Mat_<double> *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

cv::Mat_<double> mel_spectrogram_create(int nps, int n_fft, int n_mels) {
    double f_max = nps / 2.0;
    double f_min = 0;
    int n_fft_2 = 1 + n_fft / 2;
    // Initialize the weights
    //auto weights = nc::zeros<double>(nc::uint32(n_mels), nc::uint32(n_fft_2));
    auto weights = cv::Mat_<double>(n_mels, n_fft_2, 0.0);
    // Center freqs of each FFT bin
    //auto fftfreqs_ = nc::linspace<double>(f_min, f_max, nc::uint32(n_fft_2), true);
    auto fftfreqs = cvlinspace(f_min, f_max, n_fft_2);

    // 'Center freqs' of mel bands - uniformly spaced between limits
    double min_mel = hz_to_mel(f_min, false);
    double max_mel = hz_to_mel(f_max, false);
    //auto mels_ = nc::linspace(min_mel, max_mel, nc::uint32(n_mels + 2));
    auto mels = cvlinspace(min_mel, max_mel, n_mels + 2);
    auto mel_f = mel_to_hz(mels, false);

    //auto fdiff_ = nc::diff(mel_f_); //沿着指定轴计算第N维的离散差值(后一个元素减去前一个元素)
    cv::Mat_<double> d1(1, mel_f.cols * mel_f.rows - 1, (double *) (mel_f.data) + 1);
    cv::Mat_<double> d2(1, mel_f.cols * mel_f.rows - 1, (double *) (mel_f.data));
    cv::Mat_<double> fdiff = d1 - d2;

    //auto ramps = nc::subtract.outer(mel_f, fftfreqs); //nc没有subtract.outer
    //nc::NdArray<double> ramps = nc::zeros<double>(mel_f.cols, fftfreqs.cols);
    auto ramps = cv::Mat_<double>(mel_f.cols, fftfreqs.cols);
    for (int i = 0; i < mel_f.cols; i++) {
        for (int j = 0; j < fftfreqs.cols; j++) {
            ramps(i, j) = mel_f(0, i) - fftfreqs(0, j);
        }
    }

    for (int i = 0; i < n_mels; i++) {
        // lower and upper slopes for all bins
        //auto ramps_1 = nc::NdArray<double>(1, ramps.cols);
        auto ramps_1 = cv::Mat_<double>(1, ramps.cols);
        for (int j = 0; j < ramps.cols; j++) {
            ramps_1(0, j) = ramps(i, j);
        }
        //auto ramps_2 = nc::NdArray<double>(1, ramps.cols);
        auto ramps_2 = cv::Mat_<double>(1, ramps.cols);
        for (int j = 0; j < ramps.cols; j++) {
            ramps_2(0, j) = ramps(i + 2, j);
        }
        cv::Mat_<double> lower = ramps_1 * -1 / fdiff(0, i);
        cv::Mat_<double> upper = ramps_2 / fdiff(0, i + 1);
        // .. then intersect them with each other and zero
        //auto weights_1 = nc::maximum(nc::zeros<double>(1, ramps.cols), nc::minimum(lower, upper));
        cv::Mat c1 = lower;//(cv::Mat_<double>(1,5) << 1,2,-3,4,-5);
        cv::Mat c2 = upper;
        cv::Mat weights_1 = cv::Mat_<double>(1, lower.cols);
        cv::min(c1, c2, weights_1);
        cv::max(weights_1, 0, weights_1);
        for (int j = 0; j < n_fft_2; j++) {
            weights(i, j) = weights_1.at<double_t>(0, j);
        }
    }

    // Slaney-style mel is scaled to be approx constant energy per channel
    auto enorm = cv::Mat_<double>(1, n_mels);
    for (int j = 0; j < n_mels; j++) {
        enorm(0, j) = 2.0 / (mel_f(0, j + 2) - mel_f(0, j));
    }
    for (int j = 0; j < n_mels; j++) {
        for (int k = 0; k < n_fft_2; k++) {
            weights(j, k) *= enorm(0, j);
        }
    }
    return weights;
}